

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_common.hpp
# Opt level: O0

bool chaiscript::AST_Node::get_bool_condition(Boxed_Value *t_bv)

{
  Result_Type RVar1;
  bad_boxed_cast *anon_var_0;
  Type_Conversions_State *in_stack_000000c0;
  Boxed_Value *in_stack_000000c8;
  
  RVar1 = boxed_cast<bool>(in_stack_000000c8,in_stack_000000c0);
  return RVar1;
}

Assistant:

static bool get_bool_condition(const Boxed_Value &t_bv) {
        try {
          return boxed_cast<bool>(t_bv);
        }
        catch (const exception::bad_boxed_cast &) {
          throw exception::eval_error("Condition not boolean");
        }
      }